

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

ostringstream * toml::detail::format_line(ostringstream *oss,size_t lnw,size_t linenum,string *line)

{
  bool bVar1;
  _Setw _Var2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  const_iterator cVar6;
  reference pcVar7;
  ulong in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *psVar8;
  string local_68 [39];
  char local_41;
  char *local_40;
  
  poVar4 = std::operator<<((ostream *)in_RDI,' ');
  pvVar5 = (void *)std::ostream::operator<<(poVar4,color::ansi::bold);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,color::ansi::blue);
  _Var2 = CLI::std::setw(in_ESI);
  poVar4 = std::operator<<(poVar4,(_Setw)_Var2._M_n);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::right);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,in_RDX);
  poVar4 = std::operator<<(poVar4," | ");
  std::ostream::operator<<(poVar4,color::ansi::reset);
  cVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          begin(in_stack_ffffffffffffff68);
  local_40 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                               (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar7 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xffffffffffffffc8);
    local_41 = *pcVar7;
    iVar3 = isgraph((int)local_41);
    if ((iVar3 == 0) && (local_41 != ' ')) {
      psVar8 = local_68;
      in_stack_ffffffffffffff70 = in_RDI;
      show_char_abi_cxx11_((int)((ulong)cVar6._M_current >> 0x20));
      std::operator<<((ostream *)in_stack_ffffffffffffff70,psVar8);
      std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    }
    else {
      std::operator<<((ostream *)in_RDI,local_41);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  std::operator<<((ostream *)in_RDI,'\n');
  return (ostringstream *)in_RDI;
}

Assistant:

TOML11_INLINE std::ostringstream& format_line(std::ostringstream& oss,
    const std::size_t lnw, const std::size_t linenum, const std::string& line)
{
    // 10 | key = "value"
    oss << ' ' << color::bold << color::blue
        << std::setw(static_cast<int>(lnw))
        << std::right << linenum << " | "  << color::reset;
    for(const char c : line)
    {
        if(std::isgraph(c) || c == ' ')
        {
            oss << c;
        }
        else
        {
            oss << show_char(c);
        }
    }
    oss << '\n';
    return oss;
}